

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<std::basic_ostream<char,_std::char_traits<char>_>_*const_&,_std::basic_ostream<char,_std::char_traits<char>_>_*const_&>
::streamReconstructedExpression
          (BinaryExpr<std::basic_ostream<char,_std::char_traits<char>_>_*const_&,_std::basic_ostream<char,_std::char_traits<char>_>_*const_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  basic_ostream<char,_std::char_traits<char>_> **in_RDX;
  basic_ostream<char,_std::char_traits<char>_> **e;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::stringify<std::ostream*>(&local_40,(Detail *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::stringify<std::ostream*>(&local_60,(Detail *)this->m_rhs,e);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }